

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall Address_P2wshAddressTest_Test::TestBody(Address_P2wshAddressTest_Test *this)

{
  Script *script_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_9a0;
  Message local_998;
  NetType local_990 [2];
  undefined1 local_988 [8];
  AssertionResult gtest_ar_10;
  Message local_970;
  string local_968;
  undefined1 local_948 [8];
  AssertionResult gtest_ar_9;
  Message local_930;
  Address local_928;
  AssertHelper local_7b0;
  Message local_7a8;
  NetType local_7a0 [2];
  undefined1 local_798 [8];
  AssertionResult gtest_ar_8;
  Message local_780;
  string local_778;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_7;
  Message local_740;
  Address local_738;
  AssertHelper local_5c0;
  Message local_5b8;
  Script local_5b0;
  string local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_6;
  Message local_540;
  Pubkey local_538;
  string local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_5;
  Message local_4e8;
  ByteData local_4e0;
  string local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_4;
  Message local_490;
  WitnessVersion local_488 [2];
  undefined1 local_480 [8];
  AssertionResult gtest_ar_3;
  Message local_468;
  AddressType local_460 [2];
  undefined1 local_458 [8];
  AssertionResult gtest_ar_2;
  Message local_440;
  NetType local_438 [2];
  undefined1 local_430 [8];
  AssertionResult gtest_ar_1;
  Message local_418;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar;
  Message local_3d8 [2];
  Address local_3c8;
  undefined1 local_250 [8];
  Address address;
  Script *script;
  ScriptBuilder builder;
  ByteData160 pubkey_hash;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey pubkey;
  Address_P2wshAddressTest_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HashUtil::Hash160
            ((ByteData160 *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_28);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)&script);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_DUP);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_HASH160);
  cfd::core::ScriptBuilder::AppendData
            ((ScriptBuilder *)&script,
             (ByteData160 *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_EQUALVERIFY);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build
            ((Script *)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ScriptBuilder *)&script);
  script_00 = (Script *)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  cfd::core::Address::Address((Address *)local_250);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address(&local_3c8,kCfdSuccess,kVersion0,script_00);
      cfd::core::Address::operator=((Address *)local_250,&local_3c8);
      cfd::core::Address::~Address(&local_3c8);
    }
  }
  else {
    testing::Message::Message(local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x9a,
               "Expected: (address = Address(NetType::kMainnet, WitnessVersion::kVersion0, script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_3d8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_410,(Address *)local_250);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3f0,
             "\"bc1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqszafymy\"",
             "address.GetAddress().c_str()",
             "bc1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqszafymy",pcVar2);
  std::__cxx11::string::~string((string *)&local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_438[1] = 0;
  local_438[0] = cfd::core::Address::GetNetType((Address *)local_250);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_430,"NetType::kMainnet","address.GetNetType()",local_438 + 1,
             local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_460[1] = 3;
  local_460[0] = cfd::core::Address::GetAddressType((Address *)local_250);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_458,"AddressType::kP2wshAddress","address.GetAddressType()",
             local_460 + 1,local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  local_488[1] = 0;
  local_488[0] = cfd::core::Address::GetWitnessVersion((Address *)local_250);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_480,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             local_488 + 1,local_488);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  cfd::core::Address::GetHash(&local_4e0,(Address *)local_250);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_4c8,&local_4e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4a8,
             "\"c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201\"",
             "address.GetHash().GetHex().c_str()",
             "c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201",pcVar2);
  std::__cxx11::string::~string((string *)&local_4c8);
  cfd::core::ByteData::~ByteData(&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  cfd::core::Address::GetPubkey(&local_538,(Address *)local_250);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_520,&local_538);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_500,"\"\"","address.GetPubkey().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_520);
  cfd::core::Pubkey::~Pubkey(&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  cfd::core::Address::GetScript(&local_5b0,(Address *)local_250);
  cfd::core::Script::GetHex_abi_cxx11_(&local_578,&local_5b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_558,"\"76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac\"",
             "address.GetScript().GetHex().c_str()",
             "76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",pcVar2);
  std::__cxx11::string::~string((string *)&local_578);
  cfd::core::Script::~Script(&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address(&local_738,kCfdIllegalArgumentError,kVersion0,script_00);
      cfd::core::Address::operator=((Address *)local_250,&local_738);
      cfd::core::Address::~Address(&local_738);
    }
  }
  else {
    testing::Message::Message(&local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xa7,
               "Expected: (address = Address(NetType::kTestnet, WitnessVersion::kVersion0, script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_740);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_778,(Address *)local_250);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_758,
             "\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\"",
             "address.GetAddress().c_str()",
             "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",pcVar2);
  std::__cxx11::string::~string((string *)&local_778);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
  local_7a0[1] = 1;
  local_7a0[0] = cfd::core::Address::GetNetType((Address *)local_250);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_798,"NetType::kTestnet","address.GetNetType()",local_7a0 + 1,
             local_7a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address(&local_928,kCfdIllegalStateError,kVersion0,script_00);
      cfd::core::Address::operator=((Address *)local_250,&local_928);
      cfd::core::Address::~Address(&local_928);
    }
  }
  else {
    testing::Message::Message(&local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xad,
               "Expected: (address = Address(NetType::kRegtest, WitnessVersion::kVersion0, script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_930);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_930);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_968,(Address *)local_250);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_948,
             "\"bcrt1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqscv4d53\"",
             "address.GetAddress().c_str()",
             "bcrt1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqscv4d53",pcVar2);
  std::__cxx11::string::~string((string *)&local_968);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_948);
  if (!bVar1) {
    testing::Message::Message(&local_970);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_948);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_970);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_948);
  local_990[1] = 2;
  local_990[0] = cfd::core::Address::GetNetType((Address *)local_250);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_988,"NetType::kRegtest","address.GetNetType()",local_990 + 1,
             local_990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar1) {
    testing::Message::Message(&local_998);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9a0,&local_998);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  cfd::core::Address::~Address((Address *)local_250);
  cfd::core::Script::~Script
            ((Script *)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&script);
  cfd::core::ByteData160::~ByteData160
            ((ByteData160 *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(Address, P2wshAddressTest) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(pubkey_hash);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  const Script &script = builder.Build();

  Address address;
  EXPECT_NO_THROW((address = Address(NetType::kMainnet,
                   WitnessVersion::kVersion0, script)));
  EXPECT_STREQ("bc1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqszafymy",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address(NetType::kTestnet,
                   WitnessVersion::kVersion0, script)));
  EXPECT_STREQ("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());

  EXPECT_NO_THROW((address = Address(NetType::kRegtest,
                   WitnessVersion::kVersion0, script)));
  EXPECT_STREQ("bcrt1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqscv4d53",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
}